

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O1

void core::image::save_mvei_file(ConstPtr *image,string *filename)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  FileException *this;
  int *piVar3;
  char *msg;
  invalid_argument *this_00;
  long local_238;
  ofstream out;
  int aiStack_218 [54];
  ios_base local_140 [264];
  int local_38;
  int local_34;
  int32_t width;
  int32_t height;
  int32_t channels;
  int32_t type;
  
  peVar1 = (image->super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Null image given");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_38 = peVar1->w;
  local_34 = peVar1->h;
  width = peVar1->c;
  height = (*peVar1->_vptr_ImageBase[6])();
  iVar2 = (*((image->super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
            ->_vptr_ImageBase[4])();
  (*((image->super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    _vptr_ImageBase[3])();
  std::ofstream::ofstream(&local_238,(filename->_M_dataplus)._M_p,_S_bin);
  if (*(int *)((long)aiStack_218 + *(long *)(local_238 + -0x18)) == 0) {
    std::ostream::write((char *)&local_238,0x1258d7);
    std::ostream::write((char *)&local_238,(long)&local_38);
    std::ostream::write((char *)&local_238,(long)&local_34);
    std::ostream::write((char *)&local_238,(long)&width);
    std::ostream::write((char *)&local_238,(long)&height);
    std::ostream::write((char *)&local_238,CONCAT44(extraout_var,iVar2));
    if (*(int *)((long)aiStack_218 + *(long *)(local_238 + -0x18)) == 0) {
      local_238 = _VTT;
      *(undefined8 *)((long)&local_238 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
      std::filebuf::~filebuf((filebuf *)&out);
      std::ios_base::~ios_base(local_140);
      return;
    }
  }
  this = (FileException *)__cxa_allocate_exception(0x48);
  piVar3 = __errno_location();
  msg = strerror(*piVar3);
  util::FileException::FileException(this,filename,msg);
  __cxa_throw(this,&util::FileException::typeinfo,util::FileException::~FileException);
}

Assistant:

void
save_mvei_file (ImageBase::ConstPtr image, std::string const& filename)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    int32_t width = image->width();
    int32_t height = image->height();
    int32_t channels = image->channels();
    int32_t type = image->get_type();
    char const* data = image->get_byte_pointer();
    std::size_t size = image->get_byte_size();

    std::ofstream out(filename.c_str(), std::ios::binary);
    if (!out.good())
        throw util::FileException(filename, std::strerror(errno));

    out.write(MVEI_FILE_SIGNATURE, MVEI_FILE_SIGNATURE_LEN);
    out.write(reinterpret_cast<char const*>(&width), sizeof(int32_t));
    out.write(reinterpret_cast<char const*>(&height), sizeof(int32_t));
    out.write(reinterpret_cast<char const*>(&channels), sizeof(int32_t));
    out.write(reinterpret_cast<char const*>(&type), sizeof(int32_t));
    out.write(data, size);

    if (!out.good())
        throw util::FileException(filename, std::strerror(errno));
}